

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O3

trt_parent_cache tro_parent_cache_for_child(trt_parent_cache ca,trt_tree_ctx *tc)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  ushort uVar4;
  lysp_node_list *plVar5;
  ulong uVar6;
  trt_parent_cache tVar7;
  
  if (tc->lysc_tree != '\0') {
    return (trt_parent_cache)ZEXT816(0x1000400000000);
  }
  plVar5 = (lysp_node_list *)tc->pn;
  uVar1 = (plVar5->field_0).node.nodetype;
  uVar6 = 1;
  if (((uVar1 >> 0xc & 1) == 0) && (uVar6 = 2, (uVar1 >> 0xd & 1) == 0)) {
    uVar6 = 3;
    if ((uVar1 >> 10 & 1) == 0) {
      uVar6 = ca._0_8_ & 0xffffffff;
    }
  }
  uVar2 = (plVar5->field_0).node.flags;
  uVar4 = ca.lys_status;
  if ((uVar2 & 0x1c) != 0) {
    uVar4 = uVar2;
  }
  if (ca.ancestor == TRD_ANCESTOR_RPC_INPUT) {
    uVar3 = 0;
  }
  else if (ca.ancestor == TRD_ANCESTOR_RPC_OUTPUT) {
    uVar3 = 0x2000000000000;
  }
  else {
    uVar3 = ca._0_8_ >> 0x30;
    if ((uVar2 & 3) != 0) {
      uVar3 = (ulong)uVar2;
    }
    uVar3 = uVar3 << 0x30;
  }
  if ((uVar1 & 0x10) == 0) {
    plVar5 = ca.last_list;
  }
  tVar7._0_8_ = uVar3 | uVar6 | (ulong)uVar4 << 0x20;
  tVar7.last_list = plVar5;
  return tVar7;
}

Assistant:

static struct trt_parent_cache
tro_parent_cache_for_child(struct trt_parent_cache ca, const struct trt_tree_ctx *tc)
{
    struct trt_parent_cache ret = TRP_EMPTY_PARENT_CACHE;

    if (!tc->lysc_tree) {
        const struct lysp_node *pn = tc->pn;

        ret.ancestor =
                pn->nodetype & (LYS_INPUT) ? TRD_ANCESTOR_RPC_INPUT :
                pn->nodetype & (LYS_OUTPUT) ? TRD_ANCESTOR_RPC_OUTPUT :
                pn->nodetype & (LYS_NOTIF) ? TRD_ANCESTOR_NOTIF :
                ca.ancestor;

        ret.lys_status =
                pn->flags & (LYS_STATUS_CURR | LYS_STATUS_DEPRC | LYS_STATUS_OBSLT) ? pn->flags :
                ca.lys_status;

        ret.lys_config =
                ca.ancestor == TRD_ANCESTOR_RPC_INPUT ? 0 : /* because <flags> will be -w */
                ca.ancestor == TRD_ANCESTOR_RPC_OUTPUT ? LYS_CONFIG_R :
                pn->flags & (LYS_CONFIG_R | LYS_CONFIG_W) ? pn->flags :
                ca.lys_config;

        ret.last_list =
                pn->nodetype & (LYS_LIST) ? (struct lysp_node_list *)pn :
                ca.last_list;
    }

    return ret;
}